

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.hpp
# Opt level: O0

String * __thiscall
String::substr(String *__return_storage_ptr__,String *this,ssize start,ssize length)

{
  ulong local_30;
  usize end;
  ssize length_local;
  ssize start_local;
  String *this_local;
  
  if (start < 0) {
    length_local = this->data->len + start;
    if (length_local < 0) {
      length_local = 0;
    }
  }
  else {
    length_local = start;
    if (this->data->len < (ulong)start) {
      length_local = this->data->len;
    }
  }
  if (length < 0) {
    local_30 = this->data->len;
  }
  else {
    local_30 = length_local + length;
    if (this->data->len < local_30) {
      local_30 = this->data->len;
    }
  }
  String(__return_storage_ptr__,this->data->str + length_local,local_30 - length_local);
  return __return_storage_ptr__;
}

Assistant:

String substr(ssize start, ssize length = -1) const
  {
    if(start < 0)
    {
      start = (ssize)data->len + start;
      if(start < 0)
        start = 0;
    }
    else if((usize)start > data->len)
      start = data->len;

    usize end;
    if(length >= 0)
    {
      end = (usize)start + (usize)length;
      if(end > data->len)
        end = data->len;
    }
    else
      end = data->len;

    length = end - start;
    return String(data->str + start, length);
  }